

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_mathutils.cc
# Opt level: O2

void RigidBodyDynamics::Math::SparseSolveLx(Model *model,MatrixNd *L,VectorNd *x)

{
  uint uVar1;
  uint uVar2;
  pointer puVar3;
  double *pdVar4;
  double *pdVar5;
  long lVar6;
  double *pdVar7;
  long lVar8;
  double *pdVar9;
  uint i;
  uint uVar10;
  ulong uVar11;
  
  uVar1 = model->qdot_size;
  puVar3 = (model->lambda_q).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_start;
  pdVar4 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  pdVar5 = (L->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  lVar6 = (L->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  for (uVar10 = 1; uVar10 <= uVar1; uVar10 = uVar10 + 1) {
    uVar11 = (ulong)(uVar10 - 1);
    pdVar7 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    lVar8 = (L->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
    pdVar9 = (L->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
    uVar2 = uVar10;
    while (uVar2 = puVar3[uVar2], uVar2 != 0) {
      pdVar7[uVar11] =
           pdVar7[uVar11] - pdVar9[uVar11 + lVar8 * (ulong)(uVar2 - 1)] * pdVar7[uVar2 - 1];
    }
    pdVar4[uVar11] = pdVar4[uVar11] / pdVar5[lVar6 * uVar11 + uVar11];
  }
  return;
}

Assistant:

RBDL_DLLAPI
void SparseSolveLx (Model &model, Math::MatrixNd &L, Math::VectorNd &x) {
	for (unsigned int i = 1; i <= model.qdot_size; i++) {
		unsigned int j = model.lambda_q[i];
		while (j != 0) {
			x[i - 1] = x[i - 1] - L(i - 1,j - 1) * x[j - 1];
			j = model.lambda_q[j];
		}
		x[i - 1] = x[i - 1] / L(i - 1,i - 1);
	}
}